

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# IR.cpp
# Opt level: O0

JitProfilingInstr *
IR::JitProfilingInstr::New(OpCode opcode,Opnd *dstOpnd,Opnd *src1Opnd,Func *func)

{
  ArenaAllocatorBase<Memory::InPlaceFreeListPolicy,_4UL,_false,_0UL> *this;
  code *pcVar1;
  bool bVar2;
  undefined4 *puVar3;
  JitArenaAllocator *alloc;
  JitProfilingInstr *this_00;
  TrackAllocData local_58;
  JitProfilingInstr *local_30;
  JitProfilingInstr *profiledInstr;
  Func *func_local;
  Opnd *src1Opnd_local;
  Opnd *dstOpnd_local;
  OpCode opcode_local;
  
  profiledInstr = (JitProfilingInstr *)func;
  func_local = (Func *)src1Opnd;
  src1Opnd_local = dstOpnd;
  dstOpnd_local._6_2_ = opcode;
  bVar2 = Func::DoSimpleJitDynamicProfile(func);
  if (!bVar2) {
    AssertCount = AssertCount + 1;
    Js::Throw::LogAssert();
    puVar3 = (undefined4 *)__tls_get_addr(&PTR_01e57ed8);
    *puVar3 = 1;
    bVar2 = Js::Throw::ReportAssert
                      ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Backend/IR.cpp"
                       ,0x307,"(func->DoSimpleJitDynamicProfile())",
                       "func->DoSimpleJitDynamicProfile()");
    if (!bVar2) {
      pcVar1 = (code *)invalidInstructionException();
      (*pcVar1)();
    }
    puVar3 = (undefined4 *)__tls_get_addr(&PTR_01e57ed8);
    *puVar3 = 0;
  }
  this = (ArenaAllocatorBase<Memory::InPlaceFreeListPolicy,_4UL,_false,_0UL> *)
         (profiledInstr->super_Instr)._vptr_Instr;
  Memory::TrackAllocData::CreateTrackAllocData
            (&local_58,(type_info *)&typeinfo,0,0xffffffffffffffff,
             "/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Backend/IR.cpp"
             ,0x309);
  alloc = (JitArenaAllocator *)
          Memory::ArenaAllocatorBase<Memory::InPlaceFreeListPolicy,_4UL,_false,_0UL>::TrackAllocInfo
                    (this,&local_58);
  this_00 = (JitProfilingInstr *)new<Memory::JitArenaAllocator>(0x68,alloc,0x4e98c0);
  memset(this_00,0,0x68);
  JitProfilingInstr(this_00);
  local_30 = this_00;
  Instr::Init((Instr *)this_00,dstOpnd_local._6_2_,InstrKindJitProfiling,(Func *)profiledInstr);
  if (src1Opnd_local != (Opnd *)0x0) {
    Instr::SetDst(&local_30->super_Instr,src1Opnd_local);
  }
  if (func_local != (Func *)0x0) {
    Instr::SetSrc1(&local_30->super_Instr,(Opnd *)func_local);
  }
  local_30->profileId = 0xffff;
  local_30->arrayProfileId = 0xffff;
  (local_30->field_2).inlineCacheIndex = 0xffffffff;
  if ((local_30->field_2).inlineCacheIndex != 0xffffffff) {
    AssertCount = AssertCount + 1;
    Js::Throw::LogAssert();
    puVar3 = (undefined4 *)__tls_get_addr(&PTR_01e57ed8);
    *puVar3 = 1;
    bVar2 = Js::Throw::ReportAssert
                      ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Backend/IR.cpp"
                       ,0x319,"(profiledInstr->loopNumber == 0u - 1)",
                       "profiledInstr->loopNumber == 0u - 1");
    if (!bVar2) {
      pcVar1 = (code *)invalidInstructionException();
      (*pcVar1)();
    }
    puVar3 = (undefined4 *)__tls_get_addr(&PTR_01e57ed8);
    *puVar3 = 0;
  }
  local_30->field_0x60 = local_30->field_0x60 & 0xfe;
  local_30->field_0x60 = local_30->field_0x60 & 0xfd;
  local_30->field_0x60 = local_30->field_0x60 & 0xfb;
  local_30->field_0x60 = local_30->field_0x60 & 0xf7;
  return local_30;
}

Assistant:

JitProfilingInstr *
JitProfilingInstr::New(Js::OpCode opcode, Opnd *dstOpnd, Opnd *src1Opnd, Func * func)
{
    Assert(func->DoSimpleJitDynamicProfile());

    JitProfilingInstr * profiledInstr = JitAnew(func->m_alloc, IR::JitProfilingInstr);
    profiledInstr->Init(opcode, InstrKindJitProfiling, func);

    if (dstOpnd)
    {
        profiledInstr->SetDst(dstOpnd);
    }
    if (src1Opnd)
    {
        profiledInstr->SetSrc1(src1Opnd);
    }

#if DBG
    profiledInstr->profileId = Js::Constants::NoProfileId;
    profiledInstr->arrayProfileId = Js::Constants::NoProfileId;
    profiledInstr->inlineCacheIndex = Js::Constants::NoInlineCacheIndex;
    Assert(profiledInstr->loopNumber == 0u - 1);
#endif

    // default these to false.
    profiledInstr->isProfiledReturnCall = false;
    profiledInstr->isBeginSwitch = false;
    profiledInstr->isNewArray = false;
    profiledInstr->isLoopHelper = false;

    return profiledInstr;
}